

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O2

string * __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,false>::debug_type_abi_cxx11_
          (string *__return_storage_ptr__,
          ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,false> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (*(long **)(this + 0x55ae8) == (long *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MSX",(allocator<char> *)&local_30);
  }
  else {
    (**(code **)(**(long **)(this + 0x55ae8) + 0x28))(&local_30);
    std::operator+(__return_storage_ptr__,"MSX:",&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string debug_type() final {
			if(cartridge_primary().handler) {
				return "MSX:" + cartridge_primary().handler->debug_type();
			}
			return "MSX";
		}